

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

FastString __thiscall Strings::quotedPrintable(Strings *this,FastString *textToQuote)

{
  uchar *puVar1;
  uchar *extraout_RDX;
  uchar *puVar2;
  uchar *extraout_RDX_00;
  int i;
  long lVar3;
  FastString FVar4;
  QuotedEncoding enc;
  QuotedEncoding local_38;
  
  Bstrlib::String::String((String *)this);
  local_38.lineLength = 0;
  local_38.lastOne = -1;
  puVar1 = (textToQuote->super_tagbstring).data;
  puVar2 = extraout_RDX;
  local_38.out = (FastString *)this;
  for (lVar3 = 0; lVar3 < (textToQuote->super_tagbstring).slen; lVar3 = lVar3 + 1) {
    QuotedEncoding::quoteChar(&local_38,puVar1[lVar3]);
    puVar2 = extraout_RDX_00;
  }
  FVar4.super_tagbstring.data = puVar2;
  FVar4.super_tagbstring._0_8_ = this;
  return (FastString)FVar4.super_tagbstring;
}

Assistant:

FastString quotedPrintable(const FastString & textToQuote)
    {
        FastString out; QuotedEncoding enc(out);
        const char * text = (const char *)textToQuote;
        for (int i = 0; i < textToQuote.getLength(); i++)
            enc.quoteChar(text[i]);
        return out;
    }